

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step2(Curl_easy *data,connectdata *conn,int sockindex)

{
  ssl_backend_data *psVar1;
  ssl_config_data *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long n;
  char *pcVar6;
  int *piVar7;
  SSL_CIPHER *c;
  char *pcVar8;
  char *local_218;
  int local_204;
  char *local_200;
  long *local_1f0;
  uint local_1dc;
  long *plStack_1d8;
  uint len;
  uchar *neg_protocol;
  char local_1c8 [4];
  int sockerr;
  char extramsg [80];
  long port;
  char *hostname;
  int reason;
  int lib;
  long lerr;
  char local_148 [4];
  CURLcode result;
  char error_buffer [256];
  unsigned_long errdetail;
  int detail;
  ssl_backend_data *backend;
  ssl_connect_data *connssl;
  int err;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  psVar1 = conn->ssl[sockindex].backend;
  ERR_clear_error();
  iVar3 = SSL_connect((SSL *)psVar1->handle);
  if (iVar3 == 1) {
    conn->ssl[sockindex].connecting_state = ssl_connect_3;
    pcVar6 = SSL_get_version((SSL *)psVar1->handle);
    c = SSL_get_current_cipher((SSL *)psVar1->handle);
    pcVar8 = SSL_CIPHER_get_name(c);
    Curl_infof(data,"SSL connection using %s / %s",pcVar6,pcVar8);
    if ((*(uint *)&(conn->bits).field_0x4 >> 0x1a & 1) != 0) {
      SSL_get0_alpn_selected(psVar1->handle,&stack0xfffffffffffffe28,&local_1dc);
      if (local_1dc == 0) {
        Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
      }
      else {
        Curl_infof(data,"ALPN: server accepted %.*s",(ulong)local_1dc,plStack_1d8);
        if ((local_1dc == 2) && (iVar3 = memcmp("h2",plStack_1d8,2), iVar3 == 0)) {
          conn->alpn = '\x03';
        }
        else if ((local_1dc == 8) && (*plStack_1d8 == 0x312e312f70747468)) {
          conn->alpn = '\x02';
        }
      }
      iVar3 = -1;
      if (conn->alpn == '\x03') {
        iVar3 = 2;
      }
      Curl_multiuse_state(data,iVar3);
    }
    data_local._4_4_ = CURLE_OK;
  }
  else {
    iVar3 = SSL_get_error((SSL *)psVar1->handle,iVar3);
    if (iVar3 == 2) {
      conn->ssl[sockindex].connecting_state = ssl_connect_2_reading;
      data_local._4_4_ = CURLE_OK;
    }
    else if (iVar3 == 3) {
      conn->ssl[sockindex].connecting_state = ssl_connect_2_writing;
      data_local._4_4_ = CURLE_OK;
    }
    else if (iVar3 == 9) {
      conn->ssl[sockindex].connecting_state = ssl_connect_2;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      memset(local_148,0,0x100);
      conn->ssl[sockindex].connecting_state = ssl_connect_2;
      error_buffer._248_8_ = ERR_get_error();
      iVar4 = ERR_GET_LIB(error_buffer._248_8_);
      iVar5 = ERR_GET_REASON(error_buffer._248_8_);
      if ((iVar4 == 0x14) && ((iVar5 == 0x86 || (iVar5 == 0x415)))) {
        lerr._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
        n = SSL_get_verify_result((SSL *)psVar1->handle);
        if (n == 0) {
          strcpy(local_148,"SSL certificate verification failed");
        }
        else {
          if (((conn->http_proxy).proxytype == '\x02') &&
             (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
            psVar2 = &(data->set).proxy_ssl;
          }
          else {
            psVar2 = &(data->set).ssl;
          }
          local_1f0 = &psVar2->certverifyresult;
          *local_1f0 = n;
          pcVar6 = X509_verify_cert_error_string(n);
          curl_msnprintf(local_148,0x100,"SSL certificate problem: %s",pcVar6);
        }
      }
      else if ((iVar4 == 0x14) && (iVar5 == 0x45c)) {
        lerr._4_4_ = CURLE_SSL_CLIENTCERT;
        ossl_strerror(error_buffer._248_8_,local_148,0x100);
      }
      else {
        lerr._4_4_ = CURLE_SSL_CONNECT_ERROR;
        ossl_strerror(error_buffer._248_8_,local_148,0x100);
      }
      if ((lerr._4_4_ == CURLE_SSL_CONNECT_ERROR) && (error_buffer._248_8_ == 0)) {
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_200 = (conn->http_proxy).host.name;
        }
        else {
          local_200 = (conn->host).name;
        }
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_204 = conn->port;
        }
        else {
          local_204 = conn->remote_port;
        }
        memset(local_1c8,0,0x50);
        piVar7 = __errno_location();
        neg_protocol._4_4_ = *piVar7;
        if ((neg_protocol._4_4_ != 0) && (iVar3 == 5)) {
          Curl_strerror(neg_protocol._4_4_,local_1c8,0x50);
        }
        if (local_1c8[0] == '\0') {
          local_218 = SSL_ERROR_to_str(iVar3);
        }
        else {
          local_218 = local_1c8;
        }
        Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",local_218,local_200,
                   (long)local_204);
        data_local._4_4_ = lerr._4_4_;
      }
      else {
        Curl_failf(data,"%s",local_148);
        data_local._4_4_ = lerr._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_connect_step2(struct Curl_easy *data,
                                   struct connectdata *conn, int sockindex)
{
  int err;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;
  DEBUGASSERT(ssl_connect_2 == connssl->connecting_state
              || ssl_connect_2_reading == connssl->connecting_state
              || ssl_connect_2_writing == connssl->connecting_state);
  DEBUGASSERT(backend);

  ERR_clear_error();

  err = SSL_connect(backend->handle);
#ifndef HAVE_KEYLOG_CALLBACK
  if(Curl_tls_keylog_enabled()) {
    /* If key logging is enabled, wait for the handshake to complete and then
     * proceed with logging secrets (for TLS 1.2 or older).
     */
    ossl_log_tls12_secret(backend->handle, &backend->keylog_done);
  }
#endif

  /* 1  is fine
     0  is "not successful but was shut down controlled"
     <0 is "handshake was not successful, because a fatal error occurred" */
  if(1 != err) {
    int detail = SSL_get_error(backend->handle, err);

    if(SSL_ERROR_WANT_READ == detail) {
      connssl->connecting_state = ssl_connect_2_reading;
      return CURLE_OK;
    }
    if(SSL_ERROR_WANT_WRITE == detail) {
      connssl->connecting_state = ssl_connect_2_writing;
      return CURLE_OK;
    }
#ifdef SSL_ERROR_WANT_ASYNC
    if(SSL_ERROR_WANT_ASYNC == detail) {
      connssl->connecting_state = ssl_connect_2;
      return CURLE_OK;
    }
#endif
    else {
      /* untreated error */
      unsigned long errdetail;
      char error_buffer[256]="";
      CURLcode result;
      long lerr;
      int lib;
      int reason;

      /* the connection failed, we're not waiting for anything else. */
      connssl->connecting_state = ssl_connect_2;

      /* Get the earliest error code from the thread's error queue and remove
         the entry. */
      errdetail = ERR_get_error();

      /* Extract which lib and reason */
      lib = ERR_GET_LIB(errdetail);
      reason = ERR_GET_REASON(errdetail);

      if((lib == ERR_LIB_SSL) &&
         ((reason == SSL_R_CERTIFICATE_VERIFY_FAILED) ||
          (reason == SSL_R_SSLV3_ALERT_CERTIFICATE_EXPIRED))) {
        result = CURLE_PEER_FAILED_VERIFICATION;

        lerr = SSL_get_verify_result(backend->handle);
        if(lerr != X509_V_OK) {
          SSL_SET_OPTION_LVALUE(certverifyresult) = lerr;
          msnprintf(error_buffer, sizeof(error_buffer),
                    "SSL certificate problem: %s",
                    X509_verify_cert_error_string(lerr));
        }
        else
          /* strcpy() is fine here as long as the string fits within
             error_buffer */
          strcpy(error_buffer, "SSL certificate verification failed");
      }
#if (OPENSSL_VERSION_NUMBER >= 0x10101000L && \
    !defined(LIBRESSL_VERSION_NUMBER) && \
    !defined(OPENSSL_IS_BORINGSSL))
      /* SSL_R_TLSV13_ALERT_CERTIFICATE_REQUIRED is only available on
         OpenSSL version above v1.1.1, not LibreSSL nor BoringSSL */
      else if((lib == ERR_LIB_SSL) &&
              (reason == SSL_R_TLSV13_ALERT_CERTIFICATE_REQUIRED)) {
          /* If client certificate is required, communicate the
             error to client */
          result = CURLE_SSL_CLIENTCERT;
          ossl_strerror(errdetail, error_buffer, sizeof(error_buffer));
      }
#endif
      else {
        result = CURLE_SSL_CONNECT_ERROR;
        ossl_strerror(errdetail, error_buffer, sizeof(error_buffer));
      }

      /* detail is already set to the SSL error above */

      /* If we e.g. use SSLv2 request-method and the server doesn't like us
       * (RST connection, etc.), OpenSSL gives no explanation whatsoever and
       * the SO_ERROR is also lost.
       */
      if(CURLE_SSL_CONNECT_ERROR == result && errdetail == 0) {
        const char * const hostname = SSL_HOST_NAME();
        const long int port = SSL_HOST_PORT();
        char extramsg[80]="";
        int sockerr = SOCKERRNO;
        if(sockerr && detail == SSL_ERROR_SYSCALL)
          Curl_strerror(sockerr, extramsg, sizeof(extramsg));
        failf(data, OSSL_PACKAGE " SSL_connect: %s in connection to %s:%ld ",
              extramsg[0] ? extramsg : SSL_ERROR_to_str(detail),
              hostname, port);
        return result;
      }

      /* Could be a CERT problem */
      failf(data, "%s", error_buffer);

      return result;
    }